

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-env-vars.c
# Opt level: O1

int run_test_env_vars(void)

{
  uv_env_item_t *puVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long unaff_RBX;
  long lVar5;
  undefined8 in_R9;
  long lVar6;
  size_t size;
  char buf [10];
  int envcount;
  uv_env_item_t *envitems;
  char acStack_80 [32];
  undefined8 uStack_60;
  size_t local_58;
  char local_4e;
  undefined7 uStack_4d;
  short local_46;
  int local_44;
  uv_env_item_t *local_40;
  long local_38;
  
  uStack_60 = 0x14bfb8;
  iVar2 = uv_os_setenv((char *)0x0,"foo");
  if (iVar2 == -0x16) {
    uStack_60 = 0x14bfcf;
    iVar2 = uv_os_setenv("UV_TEST_FOO",(char *)0x0);
    if (iVar2 != -0x16) goto LAB_0014c2d6;
    uStack_60 = 0x14bfe1;
    iVar2 = uv_os_setenv((char *)0x0,(char *)0x0);
    if (iVar2 != -0x16) goto LAB_0014c2db;
    local_58 = 10;
    uStack_60 = 0x14c000;
    iVar2 = uv_os_getenv((char *)0x0,&local_4e,&local_58);
    if (iVar2 != -0x16) goto LAB_0014c2e0;
    uStack_60 = 0x14c01a;
    iVar2 = uv_os_getenv("UV_TEST_FOO",(char *)0x0,&local_58);
    if (iVar2 != -0x16) goto LAB_0014c2e5;
    uStack_60 = 0x14c036;
    iVar2 = uv_os_getenv("UV_TEST_FOO",&local_4e,(size_t *)0x0);
    if (iVar2 != -0x16) goto LAB_0014c2ea;
    local_58 = 0;
    uStack_60 = 0x14c05a;
    iVar2 = uv_os_getenv("UV_TEST_FOO",&local_4e,&local_58);
    if (iVar2 != -0x16) goto LAB_0014c2ef;
    uStack_60 = 0x14c06a;
    iVar2 = uv_os_unsetenv((char *)0x0);
    if (iVar2 != -0x16) goto LAB_0014c2f4;
    uStack_60 = 0x14c086;
    iVar2 = uv_os_setenv("UV_TEST_FOO","123456789");
    if (iVar2 != 0) goto LAB_0014c2f9;
    local_58 = 10;
    local_4e = '\0';
    uStack_60 = 0x14c0ac;
    iVar2 = uv_os_getenv("UV_TEST_FOO",&local_4e,&local_58);
    if (iVar2 != 0) goto LAB_0014c2fe;
    if (local_46 != 0x39 || CONCAT71(uStack_4d,local_4e) != 0x3837363534333231) goto LAB_0014c303;
    if (local_58 != 9) goto LAB_0014c308;
    local_58 = 9;
    local_4e = '\0';
    uStack_60 = 0x14c0fe;
    iVar2 = uv_os_getenv("UV_TEST_FOO",&local_4e,&local_58);
    if (iVar2 != -0x69) goto LAB_0014c30d;
    if (local_58 != 10) goto LAB_0014c312;
    uStack_60 = 0x14c11e;
    iVar2 = uv_os_unsetenv("UV_TEST_FOO");
    if (iVar2 != 0) goto LAB_0014c317;
    uStack_60 = 0x14c13a;
    iVar2 = uv_os_getenv("UV_TEST_FOO",&local_4e,&local_58);
    if (iVar2 != -2) goto LAB_0014c31c;
    uStack_60 = 0x14c14f;
    iVar2 = uv_os_unsetenv("UV_TEST_FOO");
    if (iVar2 != 0) goto LAB_0014c321;
    uStack_60 = 0x14c16a;
    iVar2 = uv_os_setenv("UV_TEST_FOO","");
    if (iVar2 != 0) goto LAB_0014c326;
    local_58 = 10;
    uStack_60 = 0x14c18d;
    iVar2 = uv_os_getenv("UV_TEST_FOO",&local_4e,&local_58);
    if (iVar2 != 0) goto LAB_0014c32b;
    if (local_58 != 0) goto LAB_0014c330;
    if (local_4e != '\0') goto LAB_0014c335;
    uStack_60 = 0x14c1be;
    iVar2 = uv_os_setenv("UV_TEST_FOO","123456789");
    if (iVar2 != 0) goto LAB_0014c33a;
    uStack_60 = 0x14c1d9;
    iVar2 = uv_os_setenv("UV_TEST_FOO2","");
    if (iVar2 != 0) goto LAB_0014c33f;
    uStack_60 = 0x14c1f0;
    iVar2 = uv_os_environ(&local_40,&local_44);
    puVar1 = local_40;
    if (iVar2 != 0) goto LAB_0014c344;
    lVar5 = (long)local_44;
    unaff_RBX = lVar5;
    if (lVar5 < 1) goto LAB_0014c349;
    unaff_RBX = lVar5 * 0x10;
    lVar6 = 0;
    iVar2 = 0;
    local_38 = lVar5;
    do {
      pcVar4 = *(char **)((long)&puVar1->name + lVar6);
      uStack_60 = 0x14c231;
      iVar3 = strcmp(pcVar4,"UV_TEST_FOO");
      if (iVar3 == 0) {
        uStack_60 = 0x14c265;
        iVar3 = strcmp(*(char **)((long)&puVar1->value + lVar6),"123456789");
        if (iVar3 != 0) {
          uStack_60 = 0x14c2cc;
          run_test_env_vars_cold_27();
          goto LAB_0014c2cc;
        }
LAB_0014c269:
        iVar2 = iVar2 + 1;
      }
      else {
        uStack_60 = 0x14c244;
        iVar3 = strcmp(pcVar4,"UV_TEST_FOO2");
        if (iVar3 == 0) {
          if (**(char **)((long)&puVar1->value + lVar6) == '\0') goto LAB_0014c269;
LAB_0014c2cc:
          uStack_60 = 0x14c2d1;
          run_test_env_vars_cold_26();
          goto LAB_0014c2d1;
        }
      }
      lVar6 = lVar6 + 0x10;
    } while (unaff_RBX != lVar6);
    if (iVar2 != 2) goto LAB_0014c34e;
    uStack_60 = 0x14c28e;
    uv_os_free_environ(local_40,(int)local_38);
    uStack_60 = 0x14c29a;
    iVar2 = uv_os_unsetenv("UV_TEST_FOO");
    if (iVar2 != 0) goto LAB_0014c353;
    uStack_60 = 0x14c2ae;
    iVar2 = uv_os_unsetenv("UV_TEST_FOO2");
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
LAB_0014c2d1:
    uStack_60 = 0x14c2d6;
    run_test_env_vars_cold_1();
LAB_0014c2d6:
    uStack_60 = 0x14c2db;
    run_test_env_vars_cold_2();
LAB_0014c2db:
    uStack_60 = 0x14c2e0;
    run_test_env_vars_cold_3();
LAB_0014c2e0:
    uStack_60 = 0x14c2e5;
    run_test_env_vars_cold_4();
LAB_0014c2e5:
    uStack_60 = 0x14c2ea;
    run_test_env_vars_cold_5();
LAB_0014c2ea:
    uStack_60 = 0x14c2ef;
    run_test_env_vars_cold_6();
LAB_0014c2ef:
    uStack_60 = 0x14c2f4;
    run_test_env_vars_cold_7();
LAB_0014c2f4:
    uStack_60 = 0x14c2f9;
    run_test_env_vars_cold_8();
LAB_0014c2f9:
    uStack_60 = 0x14c2fe;
    run_test_env_vars_cold_9();
LAB_0014c2fe:
    uStack_60 = 0x14c303;
    run_test_env_vars_cold_10();
LAB_0014c303:
    uStack_60 = 0x14c308;
    run_test_env_vars_cold_11();
LAB_0014c308:
    uStack_60 = 0x14c30d;
    run_test_env_vars_cold_12();
LAB_0014c30d:
    uStack_60 = 0x14c312;
    run_test_env_vars_cold_13();
LAB_0014c312:
    uStack_60 = 0x14c317;
    run_test_env_vars_cold_14();
LAB_0014c317:
    uStack_60 = 0x14c31c;
    run_test_env_vars_cold_15();
LAB_0014c31c:
    uStack_60 = 0x14c321;
    run_test_env_vars_cold_16();
LAB_0014c321:
    uStack_60 = 0x14c326;
    run_test_env_vars_cold_17();
LAB_0014c326:
    uStack_60 = 0x14c32b;
    run_test_env_vars_cold_18();
LAB_0014c32b:
    uStack_60 = 0x14c330;
    run_test_env_vars_cold_19();
LAB_0014c330:
    uStack_60 = 0x14c335;
    run_test_env_vars_cold_20();
LAB_0014c335:
    uStack_60 = 0x14c33a;
    run_test_env_vars_cold_21();
LAB_0014c33a:
    uStack_60 = 0x14c33f;
    run_test_env_vars_cold_22();
LAB_0014c33f:
    uStack_60 = 0x14c344;
    run_test_env_vars_cold_23();
LAB_0014c344:
    uStack_60 = 0x14c349;
    run_test_env_vars_cold_24();
LAB_0014c349:
    uStack_60 = 0x14c34e;
    run_test_env_vars_cold_25();
LAB_0014c34e:
    uStack_60 = 0x14c353;
    run_test_env_vars_cold_28();
LAB_0014c353:
    uStack_60 = 0x14c358;
    run_test_env_vars_cold_29();
  }
  uStack_60 = 0x14c35d;
  run_test_env_vars_cold_30();
  pcVar4 = uv_strerror(0);
  iVar2 = strcmp(pcVar4,"Success");
  if (iVar2 != 0) {
    puts("i18n error messages detected, skipping test.");
    return 0;
  }
  pcVar4 = uv_strerror(-0x16);
  pcVar4 = strstr(pcVar4,"Success");
  if (pcVar4 == (char *)0x0) {
    pcVar4 = uv_strerror(0x539);
    iVar2 = strcmp(pcVar4,"Unknown error");
    if (iVar2 != 0) goto LAB_0014c471;
    pcVar4 = uv_strerror(-0x539);
    iVar2 = strcmp(pcVar4,"Unknown error");
    if (iVar2 != 0) goto LAB_0014c476;
    pcVar4 = uv_strerror_r(-0x16,acStack_80,0x20);
    pcVar4 = strstr(pcVar4,"Success");
    if (pcVar4 != (char *)0x0) goto LAB_0014c47b;
    pcVar4 = uv_strerror_r(0x539,acStack_80,0x20);
    pcVar4 = strstr(pcVar4,"1337");
    if (pcVar4 == (char *)0x0) goto LAB_0014c480;
    pcVar4 = uv_strerror_r(-0x539,acStack_80,0x20);
    pcVar4 = strstr(pcVar4,"-1337");
    if (pcVar4 != (char *)0x0) {
      return 0;
    }
  }
  else {
    run_test_error_message_cold_1();
LAB_0014c471:
    run_test_error_message_cold_2();
LAB_0014c476:
    run_test_error_message_cold_3();
LAB_0014c47b:
    run_test_error_message_cold_4();
LAB_0014c480:
    run_test_error_message_cold_6();
  }
  run_test_error_message_cold_5();
  iVar2 = uv_translate_sys_error(1);
  if (iVar2 == -1) {
    iVar2 = uv_translate_sys_error(0x20);
    if (iVar2 != -0x20) goto LAB_0014c4f9;
    iVar2 = uv_translate_sys_error(0x16);
    if (iVar2 != -0x16) goto LAB_0014c4fe;
    iVar2 = uv_translate_sys_error(-0x16);
    if (iVar2 != -0x16) goto LAB_0014c503;
    iVar2 = uv_translate_sys_error(-0x22);
    if (iVar2 != -0x22) goto LAB_0014c508;
    iVar2 = uv_translate_sys_error(-0xd);
    if (iVar2 == -0xd) {
      iVar2 = uv_translate_sys_error(0);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0014c512;
    }
  }
  else {
    run_test_sys_error_cold_1();
LAB_0014c4f9:
    run_test_sys_error_cold_2();
LAB_0014c4fe:
    run_test_sys_error_cold_3();
LAB_0014c503:
    run_test_sys_error_cold_4();
LAB_0014c508:
    run_test_sys_error_cold_5();
  }
  run_test_sys_error_cold_6();
LAB_0014c512:
  run_test_sys_error_cold_7();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fail-always.c"
          ,0x1b,"Yes, it always fails",in_R9,unaff_RBX);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(env_vars) {
  const char* name = "UV_TEST_FOO";
  const char* name2 = "UV_TEST_FOO2";
  char buf[BUF_SIZE];
  size_t size;
  int i, r, envcount, found, found_win_special;
  uv_env_item_t* envitems;

  /* Reject invalid inputs when setting an environment variable */
  r = uv_os_setenv(NULL, "foo");
  ASSERT(r == UV_EINVAL);
  r = uv_os_setenv(name, NULL);
  ASSERT(r == UV_EINVAL);
  r = uv_os_setenv(NULL, NULL);
  ASSERT(r == UV_EINVAL);

  /* Reject invalid inputs when retrieving an environment variable */
  size = BUF_SIZE;
  r = uv_os_getenv(NULL, buf, &size);
  ASSERT(r == UV_EINVAL);
  r = uv_os_getenv(name, NULL, &size);
  ASSERT(r == UV_EINVAL);
  r = uv_os_getenv(name, buf, NULL);
  ASSERT(r == UV_EINVAL);
  size = 0;
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == UV_EINVAL);

  /* Reject invalid inputs when deleting an environment variable */
  r = uv_os_unsetenv(NULL);
  ASSERT(r == UV_EINVAL);

  /* Successfully set an environment variable */
  r = uv_os_setenv(name, "123456789");
  ASSERT(r == 0);

  /* Successfully read an environment variable */
  size = BUF_SIZE;
  buf[0] = '\0';
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == 0);
  ASSERT(strcmp(buf, "123456789") == 0);
  ASSERT(size == BUF_SIZE - 1);

  /* Return UV_ENOBUFS if the buffer cannot hold the environment variable */
  size = BUF_SIZE - 1;
  buf[0] = '\0';
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(size == BUF_SIZE);

  /* Successfully delete an environment variable */
  r = uv_os_unsetenv(name);
  ASSERT(r == 0);

  /* Return UV_ENOENT retrieving an environment variable that does not exist */
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == UV_ENOENT);

  /* Successfully delete an environment variable that does not exist */
  r = uv_os_unsetenv(name);
  ASSERT(r == 0);

  /* Setting an environment variable to the empty string does not delete it. */
  r = uv_os_setenv(name, "");
  ASSERT(r == 0);
  size = BUF_SIZE;
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == 0);
  ASSERT(size == 0);
  ASSERT(strlen(buf) == 0);

  /* Check getting all env variables. */
  r = uv_os_setenv(name, "123456789");
  ASSERT(r == 0);
  r = uv_os_setenv(name2, "");
  ASSERT(r == 0);
#ifdef _WIN32
  /* Create a special environment variable on Windows in case there are no
     naturally occurring ones. */
  r = uv_os_setenv("=Z:", "\\");
  ASSERT(r == 0);
#endif

  r = uv_os_environ(&envitems, &envcount);
  ASSERT(r == 0);
  ASSERT(envcount > 0);

  found = 0;
  found_win_special = 0;

  for (i = 0; i < envcount; i++) {
    /* printf("Env: %s = %s\n", envitems[i].name, envitems[i].value); */
    if (strcmp(envitems[i].name, name) == 0) {
      found++;
      ASSERT(strcmp(envitems[i].value, "123456789") == 0);
    } else if (strcmp(envitems[i].name, name2) == 0) {
      found++;
      ASSERT(strlen(envitems[i].value) == 0);
    } else if (envitems[i].name[0] == '=') {
      found_win_special++;
    }
  }

  ASSERT(found == 2);
#ifdef _WIN32
  ASSERT(found_win_special > 0);
#endif

  uv_os_free_environ(envitems, envcount);

  r = uv_os_unsetenv(name);
  ASSERT(r == 0);

  r = uv_os_unsetenv(name2);
  ASSERT(r == 0);

  return 0;
}